

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_library_init.c
# Opt level: O0

int ares_library_init(int flags)

{
  int iVar1;
  int flags_local;
  
  iVar1 = flags;
  if (ares_initialized != 0) {
    iVar1 = ares_init_flags;
  }
  ares_init_flags = iVar1;
  ares_initialized = ares_initialized + 1;
  return 0;
}

Assistant:

int ares_library_init(int flags)
{
  if (ares_initialized) {
    ares_initialized++;
    return ARES_SUCCESS;
  }
  ares_initialized++;

  /* NOTE: ARES_LIB_INIT_WIN32 flag no longer used */

  ares_init_flags = flags;

  return ARES_SUCCESS;
}